

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

int __thiscall
FIX::SocketServer::accept(SocketServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int optval;
  int optval_00;
  socket_handle s;
  mapped_type *pmVar2;
  socket_handle socket_local;
  
  socket_local = __fd;
  pmVar2 = std::
           map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
           ::operator[](&this->m_socketToInfo,&socket_local);
  optval = pmVar2->m_sendBufSize;
  optval_00 = pmVar2->m_rcvBufSize;
  bVar1 = pmVar2->m_noDelay;
  s = socket_accept(socket_local);
  if ((bVar1 & 1U) != 0) {
    socket_setsockopt(s,1);
  }
  if (optval != 0) {
    socket_setsockopt(s,7,optval);
  }
  if (optval_00 != 0) {
    socket_setsockopt(s,8,optval_00);
  }
  if (s != -1) {
    SocketMonitor::addConnect(&this->m_monitor,s);
  }
  return s;
}

Assistant:

socket_handle SocketServer::accept(socket_handle socket) {
  SocketInfo info = m_socketToInfo[socket];

  socket_handle result = socket_accept(socket);
  if (info.m_noDelay) {
    socket_setsockopt(result, TCP_NODELAY);
  }
  if (info.m_sendBufSize) {
    socket_setsockopt(result, SO_SNDBUF, info.m_sendBufSize);
  }
  if (info.m_rcvBufSize) {
    socket_setsockopt(result, SO_RCVBUF, info.m_rcvBufSize);
  }
  if (result != INVALID_SOCKET_HANDLE) {
    m_monitor.addConnect(result);
  }
  return result;
}